

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O3

void __thiscall
randomx::JitCompilerX86::generateSuperscalarHash<8ul>
          (JitCompilerX86 *this,SuperscalarProgram (*programs) [8],
          vector<unsigned_long,_std::allocator<unsigned_long>_> *reciprocalCache)

{
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  uint j;
  long lVar6;
  
  iVar2 = codeSshInitSize;
  memcpy(this->code + 0x3000,codeShhInit,(long)codeSshInitSize);
  iVar2 = iVar2 + 0x3000;
  this->codePos = iVar2;
  lVar6 = 0;
  while( true ) {
    if ((*programs)[lVar6].size != 0) {
      uVar5 = 0;
      do {
        generateSuperscalarCode(this,(*programs)[lVar6].programBuffer + (int)uVar5,reciprocalCache);
        uVar5 = uVar5 + 1;
      } while (uVar5 < (*programs)[lVar6].size);
      iVar2 = this->codePos;
    }
    iVar3 = codeSshLoadSize;
    memcpy(this->code + iVar2,codeShhLoad,(long)codeSshLoadSize);
    iVar3 = this->codePos + iVar3;
    this->codePos = iVar3;
    if (lVar6 == 7) break;
    puVar1 = this->code + iVar3;
    puVar1[0] = 'I';
    puVar1[1] = 0x8b;
    iVar2 = this->codePos + 2;
    this->codePos = iVar2;
    this->code[iVar2] = (char)(*programs)[lVar6].addrReg + 0xd8;
    lVar4 = (long)this->codePos + 1;
    this->codePos = (int32_t)lVar4;
    iVar2 = codeSshPrefetchSize;
    memcpy(this->code + lVar4,codeShhPrefetch,(long)codeSshPrefetchSize);
    iVar2 = this->codePos + iVar2;
    this->codePos = iVar2;
    lVar6 = lVar6 + 1;
  }
  this->code[iVar3] = 0xc3;
  this->codePos = this->codePos + 1;
  return;
}

Assistant:

void JitCompilerX86::generateSuperscalarHash(SuperscalarProgram(&programs)[N], std::vector<uint64_t> &reciprocalCache) {
		memcpy(code + superScalarHashOffset, codeShhInit, codeSshInitSize);
		codePos = superScalarHashOffset + codeSshInitSize;
		for (unsigned j = 0; j < N; ++j) {
			SuperscalarProgram& prog = programs[j];
			for (unsigned i = 0; i < prog.getSize(); ++i) {
				Instruction& instr = prog(i);
				generateSuperscalarCode(instr, reciprocalCache);
			}
			emit(codeShhLoad, codeSshLoadSize);
			if (j < N - 1) {
				emit(REX_MOV_RR64);
				emitByte(0xd8 + prog.getAddressRegister());
				emit(codeShhPrefetch, codeSshPrefetchSize);
#ifdef RANDOMX_ALIGN
				int align = (codePos % 16);
				while (align != 0) {
					int nopSize = 16 - align;
					if (nopSize > 8) nopSize = 8;
					emit(NOPX[nopSize - 1], nopSize);
					align = (codePos % 16);
				}
#endif
			}
		}
		emitByte(RET);
	}